

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

optional<slang::ConstantRange> __thiscall
slang::ast::ElementSelectExpression::evalIndex
          (ElementSelectExpression *this,EvalContext *context,ConstantValue *val,
          ConstantValue *associativeIndex,bool *softFail)

{
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  bool bVar1;
  int32_t iVar2;
  Expression *pEVar3;
  int *piVar4;
  ConstantValue *in_RDX;
  undefined8 extraout_RDX;
  EvalContext *in_RSI;
  ElementSelectExpression *in_RDI;
  undefined1 *in_R8;
  optional<slang::ConstantRange> oVar5;
  size_t maxIndex;
  int32_t i;
  int32_t width;
  int32_t i_1;
  ConstantRange range;
  optional<int> index;
  Type *valType;
  ConstantValue cs;
  ConstantValue *prevQ;
  Type *in_stack_fffffffffffffd78;
  _Optional_payload_base<int> *__t;
  undefined4 in_stack_fffffffffffffd80;
  int32_t in_stack_fffffffffffffd84;
  int left;
  Type *in_stack_fffffffffffffd88;
  Diagnostic *in_stack_fffffffffffffd90;
  SVInt *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  Diagnostic *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  DiagCode code;
  ConstantRange local_174;
  SourceLocation local_168;
  SourceLocation SStack_160;
  undefined4 local_150;
  SourceLocation local_148;
  SourceLocation SStack_140;
  undefined4 local_12c;
  size_t local_128;
  ConstantRange local_120;
  int local_118;
  bitwidth_t local_114;
  ConstantRange local_110;
  int32_t local_108;
  ConstantRange local_104;
  SourceLocation local_f8;
  SourceLocation SStack_f0;
  undefined4 local_dc;
  ConstantRange local_d8;
  SourceLocation local_c8;
  SourceLocation SStack_c0;
  undefined4 local_b8;
  _Optional_payload_base<int> local_b4;
  SourceLocation local_a8;
  SourceLocation SStack_a0;
  undefined4 local_8c;
  Type *local_88;
  undefined4 local_7c;
  ConstantValue *local_40;
  undefined1 *local_38;
  ConstantValue *local_28;
  EvalContext *local_20;
  _Storage<slang::ConstantRange,_true> local_c;
  undefined1 local_4;
  
  code = SUB84((ulong)in_stack_fffffffffffffde0 >> 0x20,0);
  local_38 = in_R8;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_40 = EvalContext::getQueueTarget(in_RSI);
  bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0xf5a911);
  if (bVar1) {
    EvalContext::setQueueTarget(local_20,local_28);
  }
  selector(in_RDI);
  Expression::eval((Expression *)in_stack_fffffffffffffd88,
                   (EvalContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  EvalContext::setQueueTarget(local_20,local_40);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xf5a975);
  if (bVar1) {
    value(in_RDI);
    local_88 = not_null<const_slang::ast::Type_*>::operator*
                         ((not_null<const_slang::ast::Type_*> *)0xf5a9f6);
    bVar1 = Type::isAssociativeArray((Type *)0xf5aa1d);
    if (bVar1) {
      bVar1 = slang::ConstantValue::hasUnknown
                        ((ConstantValue *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      if (bVar1) {
        local_8c = 0x1000c;
        pEVar3 = selector(in_RDI);
        local_a8 = (pEVar3->sourceRange).startLoc;
        SStack_a0 = (pEVar3->sourceRange).endLoc;
        range_00.endLoc._0_4_ = in_stack_fffffffffffffdd8;
        range_00.startLoc = (SourceLocation)in_stack_fffffffffffffdd0;
        range_00.endLoc._4_4_ = in_stack_fffffffffffffddc;
        EvalContext::addDiag
                  ((EvalContext *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),code
                   ,range_00);
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (ConstantValue *)in_stack_fffffffffffffd78);
      }
      else {
        slang::ConstantValue::operator=
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (ConstantValue *)in_stack_fffffffffffffd78);
      }
      *local_38 = 1;
      std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
    }
    else {
      slang::ConstantValue::integer((ConstantValue *)0xf5ab33);
      local_b4 = (_Optional_payload_base<int>)SVInt::as<int>(in_stack_fffffffffffffd98);
      bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0xf5ab71);
      if (bVar1) {
        bVar1 = Type::hasFixedRange((Type *)CONCAT44(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80));
        if (bVar1) {
          local_d8 = Type::getFixedRange(in_stack_fffffffffffffd78);
          std::optional<int>::operator*((optional<int> *)0xf5ac92);
          bVar1 = ConstantRange::containsPoint
                            ((ConstantRange *)in_stack_fffffffffffffd90,
                             (int32_t)((ulong)in_stack_fffffffffffffd88 >> 0x20));
          if (bVar1) {
            bVar1 = Type::isUnpackedArray(in_stack_fffffffffffffd78);
            if (bVar1) {
              local_104 = ConstantRange::reverse((ConstantRange *)in_stack_fffffffffffffd78);
              local_d8 = local_104;
              std::optional<int>::operator*((optional<int> *)0xf5adce);
              local_108 = ConstantRange::translateIndex
                                    ((ConstantRange *)in_stack_fffffffffffffd88,
                                     in_stack_fffffffffffffd84);
              ConstantRange::ConstantRange(&local_110,local_108,local_108);
              std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                        ((optional<slang::ConstantRange> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (ConstantRange *)in_stack_fffffffffffffd78);
            }
            else {
              not_null<const_slang::ast::Type_*>::operator->
                        ((not_null<const_slang::ast::Type_*> *)0xf5ae3c);
              local_114 = Type::getBitWidth(in_stack_fffffffffffffd88);
              std::optional<int>::operator*((optional<int> *)0xf5ae6b);
              iVar2 = ConstantRange::translateIndex
                                ((ConstantRange *)in_stack_fffffffffffffd88,
                                 in_stack_fffffffffffffd84);
              local_118 = iVar2 * local_114;
              ConstantRange::ConstantRange(&local_120,local_118 + -1 + local_114,local_118);
              std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                        ((optional<slang::ConstantRange> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (ConstantRange *)in_stack_fffffffffffffd78);
            }
          }
          else {
            if ((in_RDI->warnedAboutIndex & 1U) == 0) {
              local_dc = 0xc40007;
              local_f8 = (in_RDI->super_Expression).sourceRange.startLoc;
              SStack_f0 = (in_RDI->super_Expression).sourceRange.endLoc;
              range_02.endLoc._0_4_ = in_stack_fffffffffffffdd8;
              range_02.startLoc = (SourceLocation)in_stack_fffffffffffffdd0;
              range_02.endLoc._4_4_ = in_stack_fffffffffffffddc;
              EvalContext::addDiag
                        ((EvalContext *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),code,range_02
                        );
              Diagnostic::operator<<
                        ((Diagnostic *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                         ,(ConstantValue *)in_stack_fffffffffffffd78);
              ast::operator<<(in_stack_fffffffffffffdd0,
                              (Type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
              ;
            }
            *local_38 = 1;
            std::optional<slang::ConstantRange>::optional
                      ((optional<slang::ConstantRange> *)&local_c);
          }
        }
        else {
          bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xf5aeec);
          if (bVar1) {
            local_128 = slang::ConstantValue::size
                                  ((ConstantValue *)
                                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0xf5af2d);
            if (bVar1) {
              local_128 = local_128 + 1;
            }
            piVar4 = std::optional<int>::operator*((optional<int> *)0xf5af5e);
            if ((*piVar4 < 0) ||
               (piVar4 = std::optional<int>::operator*((optional<int> *)0xf5af70),
               local_128 <= (ulong)(long)*piVar4)) {
              local_12c = 0x23000c;
              local_148 = (in_RDI->super_Expression).sourceRange.startLoc;
              SStack_140 = (in_RDI->super_Expression).sourceRange.endLoc;
              range_03.endLoc._0_4_ = in_stack_fffffffffffffdd8;
              range_03.startLoc = (SourceLocation)in_stack_fffffffffffffdd0;
              range_03.endLoc._4_4_ = in_stack_fffffffffffffddc;
              EvalContext::addDiag
                        ((EvalContext *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),code,range_03
                        );
              Diagnostic::operator<<
                        ((Diagnostic *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                         ,(ConstantValue *)in_stack_fffffffffffffd78);
              ast::operator<<(in_stack_fffffffffffffdd0,
                              (Type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
              ;
              Diagnostic::operator<<<unsigned_long>
                        (in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
              *local_38 = 1;
              std::optional<slang::ConstantRange>::optional
                        ((optional<slang::ConstantRange> *)&local_c);
              goto LAB_00f5b147;
            }
          }
          else {
            piVar4 = std::optional<int>::operator*((optional<int> *)0xf5b04b);
            if (*piVar4 < 0) {
              local_150 = 0xc40007;
              local_168 = (in_RDI->super_Expression).sourceRange.startLoc;
              SStack_160 = (in_RDI->super_Expression).sourceRange.endLoc;
              range_04.endLoc._0_4_ = in_stack_fffffffffffffdd8;
              range_04.startLoc = (SourceLocation)in_stack_fffffffffffffdd0;
              range_04.endLoc._4_4_ = in_stack_fffffffffffffddc;
              EvalContext::addDiag
                        ((EvalContext *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),code,range_04
                        );
              Diagnostic::operator<<
                        ((Diagnostic *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                         ,(ConstantValue *)in_stack_fffffffffffffd78);
              ast::operator<<(in_stack_fffffffffffffdd0,
                              (Type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
              ;
              *local_38 = 1;
              std::optional<slang::ConstantRange>::optional
                        ((optional<slang::ConstantRange> *)&local_c);
              goto LAB_00f5b147;
            }
          }
          __t = &local_b4;
          piVar4 = std::optional<int>::operator*((optional<int> *)0xf5b103);
          left = *piVar4;
          piVar4 = std::optional<int>::operator*((optional<int> *)0xf5b112);
          ConstantRange::ConstantRange(&local_174,left,*piVar4);
          std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                    ((optional<slang::ConstantRange> *)CONCAT44(left,in_stack_fffffffffffffd80),
                     (ConstantRange *)__t);
        }
      }
      else {
        if ((in_RDI->warnedAboutIndex & 1U) == 0) {
          local_b8 = 0xc40007;
          local_c8 = (in_RDI->super_Expression).sourceRange.startLoc;
          SStack_c0 = (in_RDI->super_Expression).sourceRange.endLoc;
          range_01.endLoc._0_4_ = in_stack_fffffffffffffdd8;
          range_01.startLoc = (SourceLocation)in_stack_fffffffffffffdd0;
          range_01.endLoc._4_4_ = in_stack_fffffffffffffddc;
          EvalContext::addDiag
                    ((EvalContext *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     code,range_01);
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (ConstantValue *)in_stack_fffffffffffffd78);
          ast::operator<<(in_stack_fffffffffffffdd0,
                          (Type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        }
        *local_38 = 1;
        std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
      }
    }
  }
  else {
    std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
  }
LAB_00f5b147:
  local_7c = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xf5b154);
  oVar5.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_4);
  oVar5.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = local_c;
  return (optional<slang::ConstantRange>)
         oVar5.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> ElementSelectExpression::evalIndex(EvalContext& context,
                                                                const ConstantValue& val,
                                                                ConstantValue& associativeIndex,
                                                                bool& softFail) const {
    auto prevQ = context.getQueueTarget();
    if (val.isQueue())
        context.setQueueTarget(&val);

    ConstantValue cs = selector().eval(context);

    context.setQueueTarget(prevQ);
    if (!cs)
        return std::nullopt;

    const Type& valType = *value().type;
    if (valType.isAssociativeArray()) {
        if (cs.hasUnknown())
            context.addDiag(diag::ConstEvalAssociativeIndexInvalid, selector().sourceRange) << cs;
        else
            associativeIndex = std::move(cs);
        softFail = true;
        return std::nullopt;
    }

    std::optional<int32_t> index = cs.integer().as<int32_t>();
    if (!index) {
        if (!warnedAboutIndex)
            context.addDiag(diag::IndexOOB, sourceRange) << cs << valType;
        softFail = true;
        return std::nullopt;
    }

    if (valType.hasFixedRange()) {
        ConstantRange range = valType.getFixedRange();
        if (!range.containsPoint(*index)) {
            if (!warnedAboutIndex)
                context.addDiag(diag::IndexOOB, sourceRange) << cs << valType;
            softFail = true;
            return std::nullopt;
        }

        if (valType.isUnpackedArray()) {
            // Unpacked arrays are stored reversed in memory, so reverse the range here.
            range = range.reverse();
            int32_t i = range.translateIndex(*index);
            return ConstantRange{i, i};
        }

        // For packed arrays, we're selecting bit ranges, not necessarily single bits,
        // so multiply out by the width of each element.
        int32_t width = (int32_t)type->getBitWidth();
        int32_t i = range.translateIndex(*index) * width;
        return ConstantRange{i + width - 1, i};
    }

    if (val) {
        size_t maxIndex = val.size();
        if (val.isQueue())
            maxIndex++;

        if (*index < 0 || size_t(*index) >= maxIndex) {
            context.addDiag(diag::ConstEvalDynamicArrayIndex, sourceRange)
                << cs << valType << maxIndex;
            softFail = true;
            return std::nullopt;
        }
    }
    else if (*index < 0) {
        context.addDiag(diag::IndexOOB, sourceRange) << cs << valType;
        softFail = true;
        return std::nullopt;
    }

    return ConstantRange{*index, *index};
}